

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O0

UBool __thiscall icu_63::RuleBasedTimeZone::hasSameRules(RuleBasedTimeZone *this,TimeZone *other)

{
  bool bVar1;
  UBool UVar2;
  int iVar3;
  RuleBasedTimeZone *that;
  TimeZone *other_local;
  RuleBasedTimeZone *this_local;
  
  if (this == (RuleBasedTimeZone *)other) {
    this_local._7_1_ = '\x01';
  }
  else {
    if (this == (RuleBasedTimeZone *)0x0) {
      __cxa_bad_typeid();
    }
    bVar1 = std::type_info::operator!=
                      ((type_info *)
                       (this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[-1],
                       (type_info *)(other->super_UObject)._vptr_UObject[-1]);
    if (bVar1) {
      this_local._7_1_ = '\0';
    }
    else {
      iVar3 = (*(this->fInitialRule->super_TimeZoneRule).super_UObject._vptr_UObject[5])
                        (this->fInitialRule,other[1].super_UObject._vptr_UObject);
      if ((char)iVar3 == '\0') {
        UVar2 = compareRules(this->fHistoricRules,
                             (UVector *)other[1].fID.super_Replaceable.super_UObject._vptr_UObject);
        if ((UVar2 != '\0') &&
           (UVar2 = compareRules(this->fFinalRules,*(UVector **)&other[1].fID.fUnion), UVar2 != '\0'
           )) {
          return '\x01';
        }
        this_local._7_1_ = '\0';
      }
      else {
        this_local._7_1_ = '\0';
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

UBool
RuleBasedTimeZone::hasSameRules(const TimeZone& other) const {
    if (this == &other) {
        return TRUE;
    }
    if (typeid(*this) != typeid(other)) {
        return FALSE;
    }
    const RuleBasedTimeZone& that = (const RuleBasedTimeZone&)other;
    if (*fInitialRule != *(that.fInitialRule)) {
        return FALSE;
    }
    if (compareRules(fHistoricRules, that.fHistoricRules)
        && compareRules(fFinalRules, that.fFinalRules)) {
        return TRUE;
    }
    return FALSE;
}